

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECPublicKey.cpp
# Opt level: O0

unsigned_long __thiscall OSSLECPublicKey::getOrderLength(OSSLECPublicKey *this)

{
  int iVar1;
  EC_GROUP *group;
  BIGNUM *order_00;
  long in_RDI;
  unsigned_long len;
  BIGNUM *order;
  EC_GROUP *grp;
  undefined8 local_8;
  
  group = EC_KEY_get0_group(*(EC_KEY **)(in_RDI + 0x58));
  if (group == (EC_GROUP *)0x0) {
    local_8 = 0;
  }
  else {
    order_00 = BN_new();
    if (order_00 == (BIGNUM *)0x0) {
      local_8 = 0;
    }
    else {
      iVar1 = EC_GROUP_get_order(group,order_00,(BN_CTX *)0x0);
      if (iVar1 == 0) {
        BN_clear_free(order_00);
        local_8 = 0;
      }
      else {
        iVar1 = BN_num_bits(order_00);
        local_8 = (unsigned_long)((iVar1 + 7) / 8);
        BN_clear_free(order_00);
      }
    }
  }
  return local_8;
}

Assistant:

unsigned long OSSLECPublicKey::getOrderLength() const
{
	const EC_GROUP* grp = EC_KEY_get0_group(eckey);
	if (grp != NULL)
	{
		BIGNUM* order = BN_new();
		if (order == NULL)
			return 0;
		if (!EC_GROUP_get_order(grp, order, NULL))
		{
			BN_clear_free(order);
			return 0;
		}
		unsigned long len = BN_num_bytes(order);
		BN_clear_free(order);
		return len;
	}
	return 0;
}